

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readDeepScanLineFile.cpp
# Opt level: O0

void readDeepScanLineFile
               (char *filename,Box2i *displayWindow,Box2i *dataWindow,Array2D<float_*> *dataZ,
               Array2D<Imath_3_2::half_*> *dataA,Array2D<unsigned_int> *sampleCount)

{
  int iVar1;
  uint *puVar2;
  float **ppfVar3;
  half **pphVar4;
  float *pfVar5;
  half *phVar6;
  Array2D<float_*> *in_RCX;
  int *in_RDX;
  char *in_RDI;
  Array2D<Imath_3_2::half_*> *in_R8;
  _Base_ptr in_R9;
  int j_1;
  int i_1;
  int j;
  int i;
  DeepFrameBuffer frameBuffer;
  int height;
  int width;
  Header *header;
  DeepScanLineInputFile file;
  undefined4 in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdbc;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffffdc4;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd4;
  long in_stack_fffffffffffffdd8;
  DeepFrameBuffer *in_stack_fffffffffffffde0;
  int local_190;
  int local_18c;
  int local_188;
  int local_184;
  DeepSlice local_180 [56];
  DeepSlice local_148 [56];
  Slice local_110 [56];
  Slice local_d8 [108];
  int local_6c;
  int local_68;
  undefined8 local_58;
  undefined1 local_50 [56];
  int *local_18;
  
  local_50._32_8_ = in_R9;
  local_50._40_8_ = in_R8;
  local_50._48_8_ = in_RCX;
  local_18 = in_RDX;
  iVar1 = Imf_3_4::globalThreadCount();
  Imf_3_4::DeepScanLineInputFile::DeepScanLineInputFile
            ((DeepScanLineInputFile *)local_50,in_RDI,iVar1);
  local_58 = Imf_3_4::DeepScanLineInputFile::header();
  Imf_3_4::Header::dataWindow();
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator=
            ((Box<Imath_3_2::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
             (Box<Imath_3_2::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
  Imf_3_4::Header::displayWindow();
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator=
            ((Box<Imath_3_2::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
             (Box<Imath_3_2::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
  local_68 = (local_18[2] - *local_18) + 1;
  local_6c = (local_18[3] - local_18[1]) + 1;
  Imf_3_4::Array2D<unsigned_int>::resizeErase
            ((Array2D<unsigned_int> *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
             CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
  Imf_3_4::Array2D<float_*>::resizeErase
            ((Array2D<float_*> *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
             CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
  Imf_3_4::Array2D<Imath_3_2::half_*>::resizeErase
            ((Array2D<Imath_3_2::half_*> *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
             CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
  Imf_3_4::DeepFrameBuffer::DeepFrameBuffer(in_stack_fffffffffffffde0);
  puVar2 = Imf_3_4::Array2D<unsigned_int>::operator[]((Array2D<unsigned_int> *)local_50._32_8_,0);
  Imf_3_4::Slice::Slice
            (local_110,UINT,(char *)(puVar2 + (-(long)*local_18 - (long)(local_18[1] * local_68))),4
             ,(long)local_68 << 2,1,1,0.0,false,false);
  Imf_3_4::DeepFrameBuffer::insertSampleCountSlice(local_d8);
  ppfVar3 = Imf_3_4::Array2D<float_*>::operator[]((Array2D<float_*> *)local_50._48_8_,0);
  Imf_3_4::DeepSlice::DeepSlice
            (local_148,FLOAT,(char *)(ppfVar3 + (-(long)*local_18 - (long)(local_18[1] * local_68)))
             ,8,(long)local_68 << 3,4,1,1,0.0,false,false);
  Imf_3_4::DeepFrameBuffer::insert((char *)local_d8,(DeepSlice *)"dataZ");
  pphVar4 = Imf_3_4::Array2D<Imath_3_2::half_*>::operator[]
                      ((Array2D<Imath_3_2::half_*> *)local_50._40_8_,0);
  uVar7 = 1;
  Imf_3_4::DeepSlice::DeepSlice
            (local_180,HALF,(char *)(pphVar4 + (-(long)*local_18 - (long)(local_18[1] * local_68))),
             8,(long)local_68 << 3,2,1,1,0.0,false,false);
  Imf_3_4::DeepFrameBuffer::insert((char *)local_d8,(DeepSlice *)"dataA");
  Imf_3_4::DeepScanLineInputFile::setFrameBuffer((DeepFrameBuffer *)local_50);
  Imf_3_4::DeepScanLineInputFile::readPixelSampleCounts((int)local_50,local_18[1]);
  for (local_184 = 0; local_184 < local_6c; local_184 = local_184 + 1) {
    for (local_188 = 0; local_188 < local_68; local_188 = local_188 + 1) {
      puVar2 = Imf_3_4::Array2D<unsigned_int>::operator[]
                         ((Array2D<unsigned_int> *)local_50._32_8_,(long)local_184);
      pfVar5 = (float *)operator_new__((ulong)puVar2[local_188] << 2);
      ppfVar3 = Imf_3_4::Array2D<float_*>::operator[]
                          ((Array2D<float_*> *)local_50._48_8_,(long)local_184);
      ppfVar3[local_188] = pfVar5;
      puVar2 = Imf_3_4::Array2D<unsigned_int>::operator[]
                         ((Array2D<unsigned_int> *)local_50._32_8_,(long)local_184);
      phVar6 = (half *)operator_new__((ulong)puVar2[local_188] * 2);
      pphVar4 = Imf_3_4::Array2D<Imath_3_2::half_*>::operator[]
                          ((Array2D<Imath_3_2::half_*> *)local_50._40_8_,(long)local_184);
      pphVar4[local_188] = phVar6;
    }
  }
  Imf_3_4::DeepScanLineInputFile::readPixels((int)local_50,local_18[1]);
  for (local_18c = 0; local_18c < local_6c; local_18c = local_18c + 1) {
    for (local_190 = 0; local_190 < local_68; local_190 = local_190 + 1) {
      ppfVar3 = Imf_3_4::Array2D<float_*>::operator[]
                          ((Array2D<float_*> *)local_50._48_8_,(long)local_18c);
      if (ppfVar3[local_190] != (float *)0x0) {
        operator_delete__(ppfVar3[local_190]);
      }
      pphVar4 = Imf_3_4::Array2D<Imath_3_2::half_*>::operator[]
                          ((Array2D<Imath_3_2::half_*> *)local_50._40_8_,(long)local_18c);
      if (pphVar4[local_190] != (half *)0x0) {
        operator_delete__(pphVar4[local_190]);
      }
    }
  }
  Imf_3_4::DeepFrameBuffer::~DeepFrameBuffer((DeepFrameBuffer *)0x107f3d);
  Imf_3_4::DeepScanLineInputFile::~DeepScanLineInputFile
            ((DeepScanLineInputFile *)CONCAT44(in_stack_fffffffffffffdc4,uVar7));
  return;
}

Assistant:

void
readDeepScanLineFile (
    const char             filename[],
    Box2i&                 displayWindow,
    Box2i&                 dataWindow,
    Array2D<float*>&       dataZ,
    Array2D<half*>&        dataA,
    Array2D<unsigned int>& sampleCount)
{
    DeepScanLineInputFile file (filename);

    const Header& header = file.header ();
    dataWindow           = header.dataWindow ();
    displayWindow        = header.displayWindow ();

    int width  = dataWindow.max.x - dataWindow.min.x + 1;
    int height = dataWindow.max.y - dataWindow.min.y + 1;

    sampleCount.resizeErase (height, width);

    dataZ.resizeErase (height, width);
    dataA.resizeErase (height, width);

    DeepFrameBuffer frameBuffer;

    frameBuffer.insertSampleCountSlice (Slice (
        UINT,
        (char*) (&sampleCount[0][0] - dataWindow.min.x - dataWindow.min.y * width),
        sizeof (unsigned int) * 1,       // xStride
        sizeof (unsigned int) * width)); // yStride

    frameBuffer.insert (
        "dataZ",
        DeepSlice (
            FLOAT,
            (char*) (&dataZ[0][0] - dataWindow.min.x - dataWindow.min.y * width),

            sizeof (float*) * 1,     // xStride for pointer array
            sizeof (float*) * width, // yStride for pointer array
            sizeof (float) * 1));    // stride for Z data sample

    frameBuffer.insert (
        "dataA",
        DeepSlice (
            HALF,
            (char*) (&dataA[0][0] - dataWindow.min.x - dataWindow.min.y * width),
            sizeof (half*) * 1,     // xStride for pointer array
            sizeof (half*) * width, // yStride for pointer array
            sizeof (half) * 1));    // stride for O data sample

    file.setFrameBuffer (frameBuffer);

    file.readPixelSampleCounts (dataWindow.min.y, dataWindow.max.y);

    for (int i = 0; i < height; i++)
    {
        for (int j = 0; j < width; j++)
        {

            dataZ[i][j] = new float[sampleCount[i][j]];
            dataA[i][j] = new half[sampleCount[i][j]];
        }
    }

    file.readPixels (dataWindow.min.y, dataWindow.max.y);

    for (int i = 0; i < height; i++)
    {
        for (int j = 0; j < width; j++)
        {
            delete[] dataZ[i][j];
            delete[] dataA[i][j];
        }
    }
}